

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::insert_string
          (QTextDocumentPrivate *this,int pos,uint strPos,uint length,int format,Operation op)

{
  QChar QVar1;
  uint uVar2;
  uint uVar3;
  uint formatIndex;
  QTextFragmentData *pQVar4;
  QTextFrame *pQVar5;
  QTextFramePrivate *i;
  int in_EDX;
  QTextDocumentPrivate *in_RDI;
  int in_R8D;
  int in_stack_00000018;
  int in_stack_0000001c;
  QTextFrame *frame;
  int b;
  uint w;
  QTextFragmentData *X;
  uint x;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  QFragmentMap<QTextBlockData> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  BlockMap *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc4;
  QTextDocumentPrivate *in_stack_ffffffffffffffc8;
  uint uVar6;
  
  split(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  uVar2 = QFragmentMap<QTextFragmentData>::insert_single
                    ((QFragmentMap<QTextFragmentData> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(uint)in_stack_ffffffffffffffa8
                    );
  pQVar4 = QFragmentMap<QTextFragmentData>::fragment
                     ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffffa0,
                      in_stack_ffffffffffffff9c);
  pQVar4->format = in_R8D;
  pQVar4->stringPosition = in_EDX;
  uVar3 = QFragmentMap<QTextFragmentData>::previous
                    ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff9c);
  if (uVar3 != 0) {
    unite(in_RDI,in_stack_ffffffffffffffb4);
  }
  formatIndex = QFragmentMap<QTextBlockData>::findNode
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                           in_stack_ffffffffffffff98);
  this_00 = &in_RDI->blocks;
  uVar6 = formatIndex;
  QFragmentMap<QTextBlockData>::size
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  QFragmentMap<QTextBlockData>::setSize
            ((QFragmentMap<QTextBlockData> *)CONCAT44(formatIndex,in_stack_ffffffffffffffb0),
             (uint)((ulong)this_00 >> 0x20),(int)this_00,
             (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  objectForFormat(in_RDI,formatIndex);
  pQVar5 = qobject_cast<QTextFrame*>((QObject *)0x7d1707);
  if (pQVar5 != (QTextFrame *)0x0) {
    i = QTextFrame::d_func((QTextFrame *)0x7d171e);
    QVar1 = QString::at((QString *)this_00,(qsizetype)i);
    (**(code **)(*(long *)&i->super_QTextObjectPrivate + 0x20))(i,QVar1.ucs,uVar2,QVar1.ucs);
    in_RDI->framesDirty = true;
  }
  adjustDocumentChangesAndCursors
            ((QTextDocumentPrivate *)CONCAT44(uVar3,uVar6),in_stack_0000001c,in_stack_00000018,
             (Operation)((ulong)pQVar5 >> 0x20));
  return;
}

Assistant:

void QTextDocumentPrivate::insert_string(int pos, uint strPos, uint length, int format, QTextUndoCommand::Operation op)
{
    // ##### optimize when only appending to the fragment!
    Q_ASSERT(noBlockInString(QStringView{text}.mid(strPos, length)));

    split(pos);
    uint x = fragments.insert_single(pos, length);
    QTextFragmentData *X = fragments.fragment(x);
    X->format = format;
    X->stringPosition = strPos;
    uint w = fragments.previous(x);
    if (w)
        unite(w);

    int b = blocks.findNode(pos);
    blocks.setSize(b, blocks.size(b)+length);

    Q_ASSERT(blocks.length() == fragments.length());

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(format));
    if (frame) {
        frame->d_func()->fragmentAdded(text.at(strPos), x);
        framesDirty = true;
    }

    adjustDocumentChangesAndCursors(pos, length, op);
}